

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

void Sbl_ManGetCurrentMapping(Sbl_Man_t *p)

{
  Vec_Wec_t *p_00;
  int iVar1;
  word wVar2;
  word wVar3;
  word wVar4;
  word wVar5;
  Vec_Int_t *p_01;
  int local_44;
  int iObj;
  int b;
  int c;
  int i;
  word CutN2;
  word CutN1;
  word CutI2;
  word CutI1;
  Vec_Int_t *vObj;
  Sbl_Man_t *p_local;
  
  Vec_WecClear(p->vWindow);
  p_00 = p->vWindow;
  iVar1 = Vec_IntSize(p->vAnds);
  Vec_WecInit(p_00,iVar1);
  iVar1 = Vec_IntSize(p->vSolCur);
  if (iVar1 < 1) {
    __assert_fail("Vec_IntSize(p->vSolCur) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                  ,0x10c,"void Sbl_ManGetCurrentMapping(Sbl_Man_t *)");
  }
  b = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vSolCur);
    if (iVar1 <= b) {
      return;
    }
    iVar1 = Vec_IntEntry(p->vSolCur,b);
    wVar2 = Vec_WrdEntry(p->vCutsI1,iVar1);
    wVar3 = Vec_WrdEntry(p->vCutsI2,iVar1);
    wVar4 = Vec_WrdEntry(p->vCutsN1,iVar1);
    wVar5 = Vec_WrdEntry(p->vCutsN2,iVar1);
    iVar1 = Vec_IntEntry(p->vCutsObj,iVar1);
    p_01 = Vec_WecEntry(p->vWindow,iVar1);
    Vec_IntClear(p_01);
    iVar1 = Vec_IntSize(p_01);
    if (iVar1 != 0) break;
    for (local_44 = 0; local_44 < 0x40; local_44 = local_44 + 1) {
      if ((wVar2 >> ((byte)local_44 & 0x3f) & 1) != 0) {
        iVar1 = Vec_IntEntry(p->vLeaves,local_44);
        Vec_IntPush(p_01,iVar1);
      }
    }
    for (local_44 = 0; local_44 < 0x40; local_44 = local_44 + 1) {
      if ((wVar3 >> ((byte)local_44 & 0x3f) & 1) != 0) {
        iVar1 = Vec_IntEntry(p->vLeaves,local_44 + 0x40);
        Vec_IntPush(p_01,iVar1);
      }
    }
    for (local_44 = 0; local_44 < 0x40; local_44 = local_44 + 1) {
      if ((wVar4 >> ((byte)local_44 & 0x3f) & 1) != 0) {
        iVar1 = Vec_IntEntry(p->vAnds,local_44);
        Vec_IntPush(p_01,iVar1);
      }
    }
    for (local_44 = 0; local_44 < 0x40; local_44 = local_44 + 1) {
      if ((wVar5 >> ((byte)local_44 & 0x3f) & 1) != 0) {
        iVar1 = Vec_IntEntry(p->vAnds,local_44 + 0x40);
        Vec_IntPush(p_01,iVar1);
      }
    }
    b = b + 1;
  }
  __assert_fail("Vec_IntSize(vObj) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                ,0x117,"void Sbl_ManGetCurrentMapping(Sbl_Man_t *)");
}

Assistant:

void Sbl_ManGetCurrentMapping( Sbl_Man_t * p )
{
    Vec_Int_t * vObj;
    word CutI1, CutI2, CutN1, CutN2;
    int i, c, b, iObj;
    Vec_WecClear( p->vWindow );
    Vec_WecInit( p->vWindow, Vec_IntSize(p->vAnds) );
    assert( Vec_IntSize(p->vSolCur) > 0 );
    Vec_IntForEachEntry( p->vSolCur, c, i )
    {
        CutI1 = Vec_WrdEntry( p->vCutsI1, c );
        CutI2 = Vec_WrdEntry( p->vCutsI2, c );
        CutN1 = Vec_WrdEntry( p->vCutsN1, c );
        CutN2 = Vec_WrdEntry( p->vCutsN2, c );
        iObj  = Vec_IntEntry( p->vCutsObj, c );
        //iObj  = Vec_IntEntry( p->vAnds, iObj );
        vObj  = Vec_WecEntry( p->vWindow, iObj );
        Vec_IntClear( vObj );
        assert( Vec_IntSize(vObj) == 0 );
        for ( b = 0; b < 64; b++ )
            if ( (CutI1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutI2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, 64+b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, 64+b) );
    }
}